

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2.cc
# Opt level: O0

void BLAKE2B256_Final(uint8_t *out,BLAKE2B_CTX *b2b)

{
  BLAKE2B_CTX *b2b_local;
  uint8_t *out_local;
  
  OPENSSL_memset(b2b->block + b2b->block_used,0,0x80 - b2b->block_used);
  blake2b_transform(b2b,b2b->block,b2b->block_used,1);
  *(uint64_t *)out = b2b->h[0];
  *(uint64_t *)(out + 8) = b2b->h[1];
  *(uint64_t *)(out + 0x10) = b2b->h[2];
  *(uint64_t *)(out + 0x18) = b2b->h[3];
  return;
}

Assistant:

void BLAKE2B256_Final(uint8_t out[BLAKE2B256_DIGEST_LENGTH], BLAKE2B_CTX *b2b) {
  OPENSSL_memset(&b2b->block[b2b->block_used], 0,
                 sizeof(b2b->block) - b2b->block_used);
  blake2b_transform(b2b, b2b->block, b2b->block_used,
                    /*is_final_block=*/1);
  static_assert(BLAKE2B256_DIGEST_LENGTH <= sizeof(b2b->h), "");
  memcpy(out, b2b->h, BLAKE2B256_DIGEST_LENGTH);
}